

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  BYTE *d;
  ushort *puVar9;
  ushort *__src;
  ushort *puVar10;
  long lVar11;
  byte *pbVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  BYTE *s;
  byte *pbVar22;
  ulong uVar23;
  char *pcVar24;
  ushort *puVar25;
  ushort *puVar26;
  BYTE *d_1;
  char *pcVar27;
  BYTE *d_2;
  ulong uVar28;
  char *pcVar29;
  int local_48;
  
  local_48 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        local_48 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      lVar15 = (long)maxOutputSize;
      if (0x3f < maxOutputSize) {
        lVar18 = 0;
        puVar25 = (ushort *)source;
LAB_0010a6f2:
        do {
          pcVar27 = dest + lVar18;
          __src = (ushort *)((long)puVar25 + 1);
          bVar4 = (byte)*puVar25;
          uVar21 = (uint)bVar4;
          uVar28 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010ac16;
            puVar26 = puVar25 + 1;
            uVar19 = 0;
            puVar25 = puVar25 + 8;
            do {
              puVar10 = puVar25;
              puVar9 = __src;
              __src = (ushort *)((long)puVar9 + 1);
              uVar19 = uVar19 + *(byte *)((long)puVar10 + -0xf);
              puVar26 = (ushort *)((long)puVar26 + 1);
              puVar25 = (ushort *)((long)puVar10 + 1);
            } while (puVar10 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar10 + -0xf) == 0xff);
            uVar28 = (ulong)uVar19 + 0xf;
            if ((CARRY8((ulong)pcVar27,uVar28)) || ((ulong)-(long)puVar26 < uVar28)) {
              __src = puVar10 + -7;
              goto LAB_0010ac16;
            }
            lVar17 = lVar18 + uVar28;
            if (dest + lVar15 + -0x20 < dest + lVar17) goto LAB_0010aae6;
            puVar25 = (ushort *)((ulong)uVar19 + (long)puVar10 + 1);
            if (puVar1 + -0x10 < puVar25) {
              __src = puVar10 + -7;
              goto LAB_0010aae6;
            }
            lVar18 = 0;
            do {
              uVar7 = *(undefined8 *)((byte *)((long)__src + lVar18) + 8);
              pcVar3 = pcVar27 + lVar18;
              *(undefined8 *)pcVar3 = *(undefined8 *)((long)__src + lVar18);
              *(undefined8 *)(pcVar3 + 8) = uVar7;
              pbVar12 = (byte *)((long)puVar9 + lVar18 + 0x11);
              uVar7 = *(undefined8 *)(pbVar12 + 8);
              *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar12;
              *(undefined8 *)(pcVar3 + 0x18) = uVar7;
              lVar18 = lVar18 + 0x20;
            } while (pcVar3 + 0x20 < dest + lVar17);
          }
          else {
            lVar17 = lVar18 + uVar28;
            if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010aae6;
            uVar7 = *(undefined8 *)((long)puVar25 + 9);
            *(undefined8 *)pcVar27 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar27 + 8) = uVar7;
            puVar25 = (ushort *)(uVar28 + (long)__src);
          }
          pbVar12 = (byte *)(dest + lVar17);
          uVar6 = *puVar25;
          uVar28 = (ulong)uVar6;
          uVar19 = (uint)uVar6;
          __src = puVar25 + 1;
          lVar11 = lVar17 - uVar28;
          pbVar22 = (byte *)(dest + lVar11);
          uVar23 = (ulong)(bVar4 & 0xf);
          if (uVar23 == 0xf) {
            if (lVar11 < -0x10000) goto LAB_0010ac16;
            uVar21 = 0;
            puVar25 = __src;
            do {
              __src = (ushort *)((long)puVar25 + 1);
              if (puVar1 + -2 <= __src) goto LAB_0010ac16;
              uVar8 = *puVar25;
              uVar21 = uVar21 + (byte)uVar8;
              puVar25 = __src;
            } while ((byte)uVar8 == 0xff);
            uVar16 = (ulong)uVar21;
            if ((byte *)(-0x10 - uVar16) < pbVar12) goto LAB_0010ac16;
            uVar23 = uVar16 + 0x13;
            if (dest + lVar15 + -0x40 <= pbVar12 + uVar16 + 0x13) goto LAB_0010ab70;
LAB_0010a897:
            if (lVar11 < -0x10000) goto LAB_0010ac16;
            lVar18 = uVar23 + lVar17;
            pbVar2 = (byte *)(dest + lVar18);
            puVar25 = __src;
            if (0xf < uVar6) {
              do {
                uVar7 = *(undefined8 *)(pbVar12 + -uVar28 + 8);
                *(undefined8 *)pbVar12 = *(undefined8 *)(pbVar12 + -uVar28);
                *(undefined8 *)(pbVar12 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pbVar12 + -uVar28 + 0x10 + 8);
                *(undefined8 *)(pbVar12 + 0x10) = *(undefined8 *)(pbVar12 + -uVar28 + 0x10);
                *(undefined8 *)(pbVar12 + 0x18) = uVar7;
                pbVar12 = pbVar12 + 0x20;
              } while (pbVar12 < pbVar2);
              goto LAB_0010a6f2;
            }
            if (uVar28 == 4) {
              iVar20 = *(int *)pbVar22;
            }
            else if (uVar6 == 2) {
              iVar20 = CONCAT22(*(undefined2 *)pbVar22,*(undefined2 *)pbVar22);
            }
            else {
              if (uVar6 != 1) {
                if (uVar6 < 8) {
                  pbVar12[0] = 0;
                  pbVar12[1] = 0;
                  pbVar12[2] = 0;
                  pbVar12[3] = 0;
                  *pbVar12 = *pbVar22;
                  pbVar12[1] = pbVar22[1];
                  pbVar12[2] = pbVar22[2];
                  pbVar12[3] = pbVar22[3];
                  uVar21 = inc32table[uVar6];
                  *(undefined4 *)(pbVar12 + 4) = *(undefined4 *)(pbVar22 + uVar21);
                  pbVar22 = pbVar22 + ((ulong)uVar21 - (long)dec64table[uVar6]);
                }
                else {
                  *(undefined8 *)pbVar12 = *(undefined8 *)pbVar22;
                  pbVar22 = pbVar22 + 8;
                }
                pbVar12 = pbVar12 + 8;
                do {
                  *(undefined8 *)pbVar12 = *(undefined8 *)pbVar22;
                  pbVar12 = pbVar12 + 8;
                  pbVar22 = pbVar22 + 8;
                } while (pbVar12 < pbVar2);
                goto LAB_0010a6f2;
              }
              iVar20 = (uint)*pbVar22 * 0x1010101;
            }
            do {
              *(int *)pbVar12 = iVar20;
              *(int *)(pbVar12 + 4) = iVar20;
              pbVar12 = pbVar12 + 8;
            } while (pbVar12 < pbVar2);
            goto LAB_0010a6f2;
          }
          lVar18 = uVar23 + lVar17 + 4;
          uVar23 = uVar23 + 4;
          if (dest + lVar15 + -0x40 <= dest + lVar18) goto LAB_0010ab70;
          if (uVar6 < 8) goto LAB_0010a897;
          *(undefined8 *)pbVar12 = *(undefined8 *)pbVar22;
          *(undefined8 *)(pbVar12 + 8) = *(undefined8 *)(pbVar22 + 8);
          *(undefined2 *)(pbVar12 + 0x10) = *(undefined2 *)(pbVar22 + 0x10);
          puVar25 = __src;
        } while( true );
      }
      lVar18 = 0;
      __src = (ushort *)source;
LAB_0010abda:
      bVar4 = (byte)*__src;
      __src = (ushort *)((long)__src + 1);
      lVar17 = lVar18;
      while( true ) {
        pcVar27 = dest + lVar17;
        uVar21 = (uint)bVar4;
        if (bVar4 >> 4 == 0xf) break;
        uVar28 = (ulong)(uint)(bVar4 >> 4);
        if ((source + (long)compressedSize + -0x10 <= __src) || (dest + lVar15 + -0x20 < pcVar27))
        goto LAB_0010aae3;
        uVar7 = *(undefined8 *)(__src + 4);
        *(undefined8 *)pcVar27 = *(undefined8 *)__src;
        *(undefined8 *)(pcVar27 + 8) = uVar7;
        lVar17 = lVar18 + uVar28;
        uVar23 = (ulong)(uVar21 & 0xf);
        puVar26 = (ushort *)((long)__src + uVar28) + 1;
        uVar6 = *(ushort *)((long)__src + uVar28);
        uVar19 = (uint)uVar6;
        lVar11 = lVar17 - (ulong)uVar6;
        if (((uVar21 & 0xf) == 0xf) || (uVar6 < 8)) goto LAB_0010ab2e;
        *(undefined8 *)(dest + lVar17) = *(undefined8 *)(dest + lVar11);
        *(undefined8 *)(dest + lVar17 + 8) = *(undefined8 *)(dest + lVar11 + 8);
        *(undefined2 *)(dest + lVar17 + 0x10) = *(undefined2 *)(dest + lVar11 + 0x10);
        lVar18 = lVar17 + uVar23 + 4;
        lVar17 = uVar23 + lVar17 + 4;
        bVar4 = *(byte *)((long)__src + uVar28 + 2);
        __src = (ushort *)((long)__src + uVar28 + 3);
      }
      if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010ac16;
      pbVar12 = (byte *)((long)__src + 1);
      uVar19 = 0;
      do {
        uVar6 = *__src;
        __src = (ushort *)((long)__src + 1);
        uVar19 = uVar19 + (byte)uVar6;
        pbVar12 = pbVar12 + 1;
      } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar6 == 0xff);
      uVar28 = (ulong)uVar19 + 0xf;
      if ((CARRY8((ulong)pcVar27,uVar28)) || ((ulong)-(long)pbVar12 < uVar28)) goto LAB_0010ac16;
LAB_0010aae3:
      lVar17 = lVar18 + uVar28;
LAB_0010aae6:
      puVar25 = (ushort *)((long)__src + uVar28);
      if ((dest + lVar17 <= dest + lVar15 + -0xc) && (puVar25 <= puVar1 + -4)) {
        do {
          *(undefined8 *)pcVar27 = *(undefined8 *)__src;
          pcVar27 = pcVar27 + 8;
          __src = __src + 4;
        } while (pcVar27 < dest + lVar17);
        uVar19 = (uint)*puVar25;
        puVar26 = puVar25 + 1;
        lVar11 = lVar17 - (ulong)*puVar25;
        uVar23 = (ulong)(uVar21 & 0xf);
LAB_0010ab2e:
        __src = puVar26;
        if ((int)uVar23 == 0xf) {
          uVar21 = 0;
          do {
            puVar25 = puVar26;
            __src = (ushort *)((long)puVar25 + 1);
            if (puVar1 + -2 <= __src) goto LAB_0010ac13;
            uVar21 = uVar21 + (byte)*puVar25;
            puVar26 = __src;
          } while ((byte)*puVar25 == 0xff);
          uVar23 = (ulong)uVar21 + 0xf;
          if (CARRY8((ulong)(dest + lVar17),uVar23)) {
LAB_0010ac13:
            __src = (ushort *)((long)puVar25 + 1);
            goto LAB_0010ac16;
          }
        }
        uVar23 = uVar23 + 4;
LAB_0010ab70:
        if (lVar11 < -0x10000) goto LAB_0010ac16;
        pcVar27 = dest + lVar17;
        pcVar13 = dest + lVar11;
        lVar18 = lVar17 + uVar23;
        pcVar3 = dest + lVar18;
        if (uVar19 < 8) {
          pcVar27[0] = '\0';
          pcVar27[1] = '\0';
          pcVar27[2] = '\0';
          pcVar27[3] = '\0';
          *pcVar27 = *pcVar13;
          pcVar27[1] = pcVar13[1];
          pcVar27[2] = pcVar13[2];
          pcVar27[3] = pcVar13[3];
          uVar28 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar19 << 2));
          *(undefined4 *)(pcVar27 + 4) = *(undefined4 *)(pcVar13 + uVar28);
          pcVar13 = pcVar13 + (uVar28 - (long)*(int *)((long)dec64table + (ulong)(uVar19 << 2)));
        }
        else {
          *(undefined8 *)pcVar27 = *(undefined8 *)pcVar13;
          pcVar13 = pcVar13 + 8;
        }
        pcVar14 = pcVar27 + 8;
        if (dest + lVar15 + -0xc < pcVar3) {
          if (dest + lVar15 + -5 < pcVar3) goto LAB_0010ac16;
          pcVar27 = dest + lVar15 + -7;
          pcVar24 = pcVar13;
          pcVar29 = pcVar14;
          if (pcVar14 < pcVar27) {
            do {
              *(undefined8 *)pcVar29 = *(undefined8 *)pcVar24;
              pcVar29 = pcVar29 + 8;
              pcVar24 = pcVar24 + 8;
            } while (pcVar29 < pcVar27);
            pcVar13 = pcVar13 + ((long)pcVar27 - (long)pcVar14);
            pcVar14 = pcVar27;
          }
          for (; pcVar14 < pcVar3; pcVar14 = pcVar14 + 1) {
            cVar5 = *pcVar13;
            pcVar13 = pcVar13 + 1;
            *pcVar14 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar14 = *(undefined8 *)pcVar13;
          if (0x10 < uVar23) {
            pcVar27 = pcVar27 + 0x10;
            do {
              pcVar13 = pcVar13 + 8;
              *(undefined8 *)pcVar27 = *(undefined8 *)pcVar13;
              pcVar27 = pcVar27 + 8;
            } while (pcVar27 < pcVar3);
          }
        }
        goto LAB_0010abda;
      }
      if ((puVar25 == puVar1) && (lVar17 <= lVar15)) {
        memmove(pcVar27,__src,uVar28);
        return ((int)pcVar27 + (int)uVar28) - (int)dest;
      }
LAB_0010ac16:
      local_48 = (int)source;
      local_48 = ~(uint)__src + local_48;
    }
  }
  return local_48;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}